

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool __thiscall xatlas::internal::UniformGrid2::createGrid(UniformGrid2 *this)

{
  Array<unsigned_int> *this_00;
  Array<unsigned_int> *this_01;
  uint32_t index;
  undefined1 auVar1 [16];
  uint uVar2;
  undefined4 extraout_EAX;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint32_t i;
  uint32_t uVar6;
  uint uVar7;
  Array<unsigned_int> *this_02;
  uint32_t j;
  Vector2 VVar8;
  undefined4 extraout_XMM0_Db;
  uint uVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  float fVar12;
  uint32_t edge;
  uint8_t local_80 [4];
  uint local_7c;
  undefined8 local_78;
  undefined1 local_68 [24];
  ulong local_50;
  Extents2 local_48;
  
  uVar4 = (this->m_edges).m_base.size;
  local_48.min.x = 3.4028235e+38;
  local_48.min.y = 3.4028235e+38;
  local_48.max.x = -3.4028235e+38;
  local_48.max.y = -3.4028235e+38;
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    puVar5 = Array<unsigned_int>::operator[](&this->m_edges,uVar6);
    uVar7 = *puVar5;
    uVar2 = uVar7;
    if (this->m_indices != (uint32_t *)0x0) {
      uVar2 = this->m_indices[uVar7];
    }
    Extents2::add(&local_48,this->m_positions[uVar2]);
    VVar8 = edgePosition1(this,uVar7);
    Extents2::add(&local_48,VVar8);
  }
  this->m_gridOrigin = local_48.min;
  auVar9._0_4_ = local_48.max.x - local_48.min.x;
  auVar9._4_4_ = local_48.max.y - local_48.min.y;
  auVar9._8_8_ = 0;
  fVar12 = auVar9._0_4_;
  if (auVar9._4_4_ <= auVar9._0_4_) {
    fVar12 = auVar9._4_4_;
  }
  fVar12 = fVar12 / SQRT((float)uVar4);
  this->m_cellSize = fVar12;
  if (fVar12 <= 0.0) {
    uVar7 = 0;
  }
  else {
    auVar1._4_4_ = fVar12;
    auVar1._0_4_ = fVar12;
    auVar1._8_4_ = fVar12;
    auVar1._12_4_ = fVar12;
    local_68._0_16_ = divps(auVar9,auVar1);
    fVar12 = ceilf(local_68._0_4_);
    local_78 = (Array<unsigned_int> *)CONCAT44(extraout_XMM0_Db,fVar12);
    fVar12 = ceilf((float)local_68._4_4_);
    uVar2 = (int)((float)local_78 - 2.1474836e+09) & (int)(float)local_78 >> 0x1f |
            (int)(float)local_78;
    uVar10 = (int)(fVar12 - 2.1474836e+09) & (int)fVar12 >> 0x1f | (int)fVar12;
    this->m_gridWidth = uVar2;
    this->m_gridHeight = uVar10;
    auVar11._0_4_ = -(uint)(uVar2 == 0);
    auVar11._4_4_ = -(uint)(uVar2 == 0);
    auVar11._8_4_ = -(uint)(uVar10 == 0);
    auVar11._12_4_ = -(uint)(uVar10 == 0);
    iVar3 = movmskpd(extraout_EAX,auVar11);
    uVar7 = 0;
    if (iVar3 == 0) {
      this_00 = &this->m_cellDataOffsets;
      Array<unsigned_int>::resize(this_00,uVar10 * uVar2);
      for (; uVar7 < (this->m_cellDataOffsets).m_base.size; uVar7 = uVar7 + 1) {
        puVar5 = Array<unsigned_int>::operator[](this_00,uVar7);
        *puVar5 = 0xffffffff;
      }
      this_01 = &this->m_cellData;
      (this->m_cellData).m_base.size = 0;
      ArrayBase::reserve(&this_01->m_base,uVar4 * 2);
      local_78 = &this->m_traversedCellOffsets;
      local_50 = (ulong)uVar4;
      for (uVar6 = 0; uVar6 != (uint32_t)local_50; uVar6 = uVar6 + 1) {
        puVar5 = Array<unsigned_int>::operator[](&this->m_edges,uVar6);
        local_7c = *puVar5;
        uVar4 = local_7c;
        if (this->m_indices != (uint32_t *)0x0) {
          uVar4 = this->m_indices[local_7c];
        }
        local_68._8_8_ = 0;
        local_68._0_8_ = this->m_positions[uVar4];
        VVar8 = edgePosition1(this,local_7c);
        traverse(this,(Vector2)local_68._0_8_,VVar8);
        uVar4 = (this->m_traversedCellOffsets).m_base.size;
        if (uVar4 == 0) {
          __assert_fail("!m_traversedCellOffsets.isEmpty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x1022,"bool xatlas::internal::UniformGrid2::createGrid()");
        }
        this_02 = local_78;
        for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
          puVar5 = Array<unsigned_int>::operator[](this_02,uVar7);
          index = *puVar5;
          puVar5 = Array<unsigned_int>::operator[](this_00,index);
          uVar4 = *puVar5;
          if (uVar4 == 0xffffffff) {
            uVar4 = (this->m_cellData).m_base.size;
            puVar5 = Array<unsigned_int>::operator[](this_00,index);
            *puVar5 = uVar4;
            this_02 = local_78;
          }
          else {
            do {
              puVar5 = Array<unsigned_int>::operator[](this_01,uVar4 + 1);
              uVar4 = *puVar5;
            } while (uVar4 != 0xffffffff);
            *puVar5 = (this->m_cellData).m_base.size;
          }
          ArrayBase::push_back(&this_01->m_base,(uint8_t *)&local_7c);
          local_80[0] = 0xff;
          local_80[1] = 0xff;
          local_80[2] = 0xff;
          local_80[3] = 0xff;
          ArrayBase::push_back(&this_01->m_base,local_80);
          uVar4 = (this->m_traversedCellOffsets).m_base.size;
        }
      }
      uVar7 = 1;
    }
  }
  return SUB41(uVar7,0);
}

Assistant:

bool createGrid()
	{
		// Compute edge extents. Min will be the grid origin.
		const uint32_t edgeCount = m_edges.size();
		Extents2 edgeExtents;
		edgeExtents.reset();
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			edgeExtents.add(edgePosition0(edge));
			edgeExtents.add(edgePosition1(edge));
		}
		m_gridOrigin = edgeExtents.min;
		// Size grid to approximately one edge per cell.
		const Vector2 extentsSize(edgeExtents.max - edgeExtents.min);
		m_cellSize = min(extentsSize.x, extentsSize.y) / sqrtf((float)edgeCount);
		if (m_cellSize <= 0.0f)
			return false;
		m_gridWidth = uint32_t(ceilf(extentsSize.x / m_cellSize));
		m_gridHeight = uint32_t(ceilf(extentsSize.y / m_cellSize));
		if (m_gridWidth == 0 || m_gridHeight == 0)
			return false;
		// Insert edges into cells.
		m_cellDataOffsets.resize(m_gridWidth * m_gridHeight);
		for (uint32_t i = 0; i < m_cellDataOffsets.size(); i++)
			m_cellDataOffsets[i] = UINT32_MAX;
		m_cellData.clear();
		m_cellData.reserve(edgeCount * 2);
		for (uint32_t i = 0; i < edgeCount; i++) {
			const uint32_t edge = m_edges[i];
			traverse(edgePosition0(edge), edgePosition1(edge));
			XA_DEBUG_ASSERT(!m_traversedCellOffsets.isEmpty());
			for (uint32_t j = 0; j < m_traversedCellOffsets.size(); j++) {
				const uint32_t cell = m_traversedCellOffsets[j];
				uint32_t offset = m_cellDataOffsets[cell];
				if (offset == UINT32_MAX)
					m_cellDataOffsets[cell] = m_cellData.size();
				else {
					for (;;) {
						uint32_t &nextOffset = m_cellData[offset + 1];
						if (nextOffset == UINT32_MAX) {
							nextOffset = m_cellData.size();
							break;
						}
						offset = nextOffset;
					}
				}
				m_cellData.push_back(edge);
				m_cellData.push_back(UINT32_MAX);
			}
		}
		return true;
	}